

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute<double>
          (XmlWriter *this,string *name,double *attribute)

{
  XmlWriter *pXVar1;
  double *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  stringstream rss;
  stringstream local_1a0 [16];
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  XmlWriter *in_stack_fffffffffffffe80;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(&stack0xfffffffffffffe70,*in_RDX);
  std::__cxx11::stringstream::str();
  pXVar1 = writeAttribute(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(in_RSI);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
        std::stringstream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }